

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O2

bool __thiscall glslang::HlslGrammar::acceptSubpassInputType(HlslGrammar *this,TType *type)

{
  bool bVar1;
  EHlslTokenClass EVar2;
  uint uVar3;
  TTypeList *pTVar4;
  uint uVar5;
  char *syntax;
  TSampler sampler;
  TType subpassType;
  TType local_b0;
  
  EVar2 = HlslTokenStream::peek(&this->super_HlslTokenStream);
  if (EVar2 == EHTokSubpassInput) {
    uVar5 = 0x1f080700;
  }
  else {
    if (EVar2 != EHTokSubpassInputMS) {
      return false;
    }
    uVar5 = 0x1f0c0700;
  }
  HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
  TType::TType(&subpassType,EbtFloat,EvqUniform,4,0,0,false);
  bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftAngle);
  if (bVar1) {
    bVar1 = acceptType(this,&subpassType);
    if (bVar1) {
      if ((0xf < (byte)subpassType._8_1_) ||
         ((0x8302U >> ((byte)subpassType._8_1_ & 0x1f) & 1) == 0)) {
        unimplemented(this,"basic type in subpass input");
        return false;
      }
      bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightAngle);
      if (bVar1) goto LAB_003a8f5e;
      syntax = "right angle bracket";
    }
    else {
      syntax = "scalar or vector type";
    }
    expected(this,syntax);
    return false;
  }
LAB_003a8f5e:
  uVar3 = (uint)(byte)subpassType._8_1_;
  if ((byte)subpassType._8_1_ - 0xf < 2) {
    pTVar4 = TType::getStruct(&subpassType);
    uVar3 = (*((pTVar4->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
               ).super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
               _M_impl.super__Vector_impl_data._M_start)->type->_vptr_TType[7])();
    uVar3 = uVar3 & 0xff;
  }
  sampler = (TSampler)(uVar5 | uVar3);
  bVar1 = HlslParseContext::setTextureReturnType
                    (this->parseContext,&sampler,&subpassType,
                     &(this->super_HlslTokenStream).token.loc);
  if (bVar1) {
    TType::TType(&local_b0,&sampler,EvqUniform,(TArraySizes *)0x0);
    TType::shallowCopy(type,&local_b0);
    return bVar1;
  }
  return bVar1;
}

Assistant:

bool HlslGrammar::acceptSubpassInputType(TType& type)
{
    // read subpass type
    const EHlslTokenClass subpassInputType = peek();

    bool multisample;

    switch (subpassInputType) {
    case EHTokSubpassInput:   multisample = false; break;
    case EHTokSubpassInputMS: multisample = true;  break;
    default:
        return false;  // not a subpass input declaration
    }

    advanceToken();  // consume the sampler type keyword

    TType subpassType(EbtFloat, EvqUniform, 4); // default type is float4

    if (acceptTokenClass(EHTokLeftAngle)) {
        if (! acceptType(subpassType)) {
            expected("scalar or vector type");
            return false;
        }

        const TBasicType basicRetType = subpassType.getBasicType() ;

        switch (basicRetType) {
        case EbtFloat:
        case EbtUint:
        case EbtInt:
        case EbtStruct:
            break;
        default:
            unimplemented("basic type in subpass input");
            return false;
        }

        if (! acceptTokenClass(EHTokRightAngle)) {
            expected("right angle bracket");
            return false;
        }
    }

    const TBasicType subpassBasicType = subpassType.isStruct() ? (*subpassType.getStruct())[0].type->getBasicType()
        : subpassType.getBasicType();

    TSampler sampler;
    sampler.setSubpass(subpassBasicType, multisample);

    // Remember the declared return type.  Function returns false on error.
    if (!parseContext.setTextureReturnType(sampler, subpassType, token.loc))
        return false;

    type.shallowCopy(TType(sampler, EvqUniform));

    return true;
}